

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void av1_set_speed_features_framesize_independent(AV1_COMP *cpi,int speed)

{
  char cVar1;
  SequenceHeader *pSVar2;
  int in_ESI;
  AV1_COMP *in_RDI;
  int unaff_retaddr;
  SPEED_FEATURES *in_stack_00000008;
  AV1_COMP *in_stack_00000010;
  int mesh_speed;
  int i;
  AV1EncoderConfig *oxcf;
  WinnerModeParams *winner_mode_params;
  SPEED_FEATURES *sf;
  AV1EncoderConfig *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  byte local_35;
  int in_stack_ffffffffffffffd4;
  int iVar3;
  SPEED_FEATURES *sf_00;
  AV1_COMP *cpi_00;
  
  cpi_00 = (AV1_COMP *)&in_RDI->winner_mode_params;
  sf_00 = (SPEED_FEATURES *)&in_RDI->oxcf;
  init_hl_sf(&(in_RDI->sf).hl_sf);
  init_fp_sf(&(in_RDI->sf).fp_sf);
  init_tpl_sf(&(in_RDI->sf).tpl_sf);
  init_gm_sf(&(in_RDI->sf).gm_sf);
  init_part_sf(&(in_RDI->sf).part_sf);
  init_mv_sf(&(in_RDI->sf).mv_sf);
  init_inter_sf((INTER_MODE_SPEED_FEATURES *)0x2f9c64);
  init_interp_sf(&(in_RDI->sf).interp_sf);
  init_intra_sf(&(in_RDI->sf).intra_sf);
  init_tx_sf(&(in_RDI->sf).tx_sf);
  init_rd_sf((RD_CALC_SPEED_FEATURES *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
             ,in_stack_ffffffffffffffb8);
  init_winner_mode_sf(&(in_RDI->sf).winner_mode_sf);
  init_lpf_sf(&(in_RDI->sf).lpf_sf);
  init_rt_sf(&(in_RDI->sf).rt_sf);
  cVar1 = (char)(sf_00->rt_sf).intra_y_mode_bsize_mask_nrd[2];
  if (cVar1 == '\0') {
    set_good_speed_features_framesize_independent(in_stack_00000010,in_stack_00000008,unaff_retaddr)
    ;
  }
  else if (cVar1 == '\x01') {
    set_rt_speed_features_framesize_independent(cpi_00,sf_00,in_stack_ffffffffffffffd4);
  }
  else if (cVar1 == '\x02') {
    set_allintra_speed_features_framesize_independent(in_RDI,&in_RDI->sf,in_ESI);
  }
  if ((((sf_00->rt_sf).check_intra_pred_nonrd & 0x1000000) == 0) &&
     ((in_RDI->sf).rt_sf.use_nonrd_pick_mode == 0)) {
    (in_RDI->sf).winner_mode_sf.tx_size_search_level = 3;
  }
  if ((1 < (in_RDI->mt_info).num_workers) && (4 < in_ESI)) {
    (in_RDI->sf).lpf_sf.disable_sgr_filter = true;
    (in_RDI->sf).lpf_sf.disable_wiener_filter = true;
  }
  if (in_RDI->ppi->seq_params_locked == 0) {
    pSVar2 = (in_RDI->common).seq_params;
    (pSVar2->order_hint_info).enable_dist_wtd_comp =
         (uint)((in_RDI->sf).inter_sf.use_dist_wtd_comp_flag != '\x02') &
         (pSVar2->order_hint_info).enable_dist_wtd_comp;
    pSVar2 = (in_RDI->common).seq_params;
    pSVar2->enable_dual_filter =
         pSVar2->enable_dual_filter & ((in_RDI->sf).interp_sf.disable_dual_filter != 0 ^ 0xffU) & 1;
    local_35 = 1;
    if (((in_RDI->sf).lpf_sf.disable_wiener_filter & 1U) != 0) {
      local_35 = (in_RDI->sf).lpf_sf.disable_sgr_filter ^ 0xff;
    }
    pSVar2 = (in_RDI->common).seq_params;
    pSVar2->enable_restoration = pSVar2->enable_restoration & local_35 & 1;
    pSVar2 = (in_RDI->common).seq_params;
    pSVar2->enable_interintra_compound =
         pSVar2->enable_interintra_compound &
         (in_RDI->sf).inter_sf.disable_interintra_wedge_var_thresh != 0xffffffff;
  }
  if (4 < in_ESI) {
    in_ESI = 5;
  }
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    (in_RDI->sf).mv_sf.mesh_patterns[iVar3].range = good_quality_mesh_patterns[in_ESI][iVar3].range;
    (in_RDI->sf).mv_sf.mesh_patterns[iVar3].interval =
         *(int *)((long)in_ESI * 0x20 + 0xba84c4 + (long)iVar3 * 8);
  }
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    (in_RDI->sf).mv_sf.intrabc_mesh_patterns[iVar3].range =
         intrabc_mesh_patterns[in_ESI][iVar3].range;
    (in_RDI->sf).mv_sf.intrabc_mesh_patterns[iVar3].interval =
         *(int *)((long)in_ESI * 0x20 + 0xba8584 + (long)iVar3 * 8);
  }
  iVar3 = is_stat_generation_stage(in_RDI);
  if (iVar3 != 0) {
    (in_RDI->sf).rd_sf.optimize_coefficients = '\0';
  }
  if (((sf_00->rt_sf).rc_compute_spatial_var_sc == 0) &&
     (iVar3 = has_no_stats_stage(in_RDI), iVar3 != 0)) {
    (in_RDI->sf).hl_sf.recode_loop = '\0';
  }
  set_subpel_search_method
            (&in_RDI->mv_search_params,(in_RDI->oxcf).unit_test_cfg.motion_vector_unit_test,
             (in_RDI->sf).mv_sf.subpel_search_method);
  iVar3 = (in_RDI->sf).rd_sf.tx_domain_dist_thres_level;
  *(undefined8 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[1] + 4) =
       *(undefined8 *)tx_domain_dist_thresholds[iVar3];
  *(uint *)(cpi_00->enc_quant_dequant_params).quants.y_quant[2] =
       tx_domain_dist_thresholds[iVar3][2];
  iVar3 = (in_RDI->sf).rd_sf.tx_domain_dist_level;
  *(undefined8 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0] + 6) =
       *(undefined8 *)tx_domain_dist_types[iVar3];
  *(uint *)((cpi_00->enc_quant_dequant_params).quants.y_quant[1] + 2) =
       tx_domain_dist_types[iVar3][2];
  iVar3 = (in_RDI->sf).rd_sf.perform_coeff_opt;
  cpi_00->ppi = (AV1_PRIMARY *)coeff_opt_thresholds[iVar3][0];
  *(uint (*) [2])&cpi_00->field_0x8 = coeff_opt_thresholds[iVar3][1];
  *(uint (*) [2])(cpi_00->enc_quant_dequant_params).quants.y_quant[0] =
       coeff_opt_thresholds[iVar3][2];
  iVar3 = (in_RDI->sf).tx_sf.tx_type_search.use_skip_flag_prediction;
  *(undefined8 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 2) =
       *(undefined8 *)predict_skip_levels[iVar3];
  *(uint *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 6) =
       predict_skip_levels[iVar3][2];
  iVar3 = (in_RDI->sf).winner_mode_sf.tx_size_search_level;
  (cpi_00->enc_quant_dequant_params).quants.y_quant[0][4] =
       *(int16_t *)tx_size_search_methods[iVar3];
  *(TX_SIZE_SEARCH_METHOD *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0] + 5) =
       tx_size_search_methods[iVar3][2];
  iVar3 = (in_RDI->sf).winner_mode_sf.dc_blk_pred_level;
  *(undefined8 *)(cpi_00->enc_quant_dequant_params).quants.y_quant[3] =
       *(undefined8 *)predict_dc_levels[iVar3];
  *(uint *)((cpi_00->enc_quant_dequant_params).quants.y_quant[3] + 4) = predict_dc_levels[iVar3][2];
  if ((((in_RDI->oxcf).row_mt & 1U) == 1) && (1 < (in_RDI->mt_info).num_workers)) {
    if ((in_RDI->sf).inter_sf.inter_mode_rd_model_estimation == 1) {
      (in_RDI->sf).inter_sf.inter_mode_rd_model_estimation = 2;
    }
    if (((in_RDI->sf).gm_sf.gm_search_type != '\x04') &&
       (gm_available_reference_frames[(in_RDI->sf).gm_sf.gm_search_type] <=
        (in_RDI->mt_info).num_workers)) {
      (in_RDI->sf).gm_sf.prune_ref_frame_for_gm_search = 0;
    }
  }
  if ((in_RDI->oxcf).rc_cfg.gf_cbr_boost_pct != 0) {
    (in_RDI->sf).rt_sf.gf_refresh_based_on_qp = 0;
  }
  return;
}

Assistant:

void av1_set_speed_features_framesize_independent(AV1_COMP *cpi, int speed) {
  SPEED_FEATURES *const sf = &cpi->sf;
  WinnerModeParams *const winner_mode_params = &cpi->winner_mode_params;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  int i;

  init_hl_sf(&sf->hl_sf);
  init_fp_sf(&sf->fp_sf);
  init_tpl_sf(&sf->tpl_sf);
  init_gm_sf(&sf->gm_sf);
  init_part_sf(&sf->part_sf);
  init_mv_sf(&sf->mv_sf);
  init_inter_sf(&sf->inter_sf);
  init_interp_sf(&sf->interp_sf);
  init_intra_sf(&sf->intra_sf);
  init_tx_sf(&sf->tx_sf);
  init_rd_sf(&sf->rd_sf, oxcf);
  init_winner_mode_sf(&sf->winner_mode_sf);
  init_lpf_sf(&sf->lpf_sf);
  init_rt_sf(&sf->rt_sf);

  switch (oxcf->mode) {
    case GOOD:
      set_good_speed_features_framesize_independent(cpi, sf, speed);
      break;
    case ALLINTRA:
      set_allintra_speed_features_framesize_independent(cpi, sf, speed);
      break;
    case REALTIME:
      set_rt_speed_features_framesize_independent(cpi, sf, speed);
      break;
  }

  // Note: when use_nonrd_pick_mode is true, the transform size is the
  // minimum of 16x16 and the largest possible size of the current block,
  // which conflicts with the speed feature "enable_tx_size_search".
  if (!oxcf->txfm_cfg.enable_tx_size_search &&
      sf->rt_sf.use_nonrd_pick_mode == 0) {
    sf->winner_mode_sf.tx_size_search_level = 3;
  }

  if (cpi->mt_info.num_workers > 1) {
    // Loop restoration stage is conditionally disabled for speed 5, 6 when
    // num_workers > 1. Since av1_pick_filter_restoration() is not
    // multi-threaded, enabling the Loop restoration stage will cause an
    // increase in encode time (3% to 7% increase depends on frame
    // resolution).
    // TODO(aomedia:3446): Implement multi-threading of
    // av1_pick_filter_restoration() and enable Wiener filter for speed 5, 6
    // similar to single thread encoding path.
    if (speed >= 5) {
      sf->lpf_sf.disable_sgr_filter = true;
      sf->lpf_sf.disable_wiener_filter = true;
    }
  }

  if (!cpi->ppi->seq_params_locked) {
    cpi->common.seq_params->order_hint_info.enable_dist_wtd_comp &=
        (sf->inter_sf.use_dist_wtd_comp_flag != DIST_WTD_COMP_DISABLED);
    cpi->common.seq_params->enable_dual_filter &=
        !sf->interp_sf.disable_dual_filter;
    // Set the flag 'enable_restoration', if one the Loop restoration filters
    // (i.e., Wiener or Self-guided) is enabled.
    cpi->common.seq_params->enable_restoration &=
        (!sf->lpf_sf.disable_wiener_filter || !sf->lpf_sf.disable_sgr_filter);

    cpi->common.seq_params->enable_interintra_compound &=
        (sf->inter_sf.disable_interintra_wedge_var_thresh != UINT_MAX);
  }

  const int mesh_speed = AOMMIN(speed, MAX_MESH_SPEED);
  for (i = 0; i < MAX_MESH_STEP; ++i) {
    sf->mv_sf.mesh_patterns[i].range =
        good_quality_mesh_patterns[mesh_speed][i].range;
    sf->mv_sf.mesh_patterns[i].interval =
        good_quality_mesh_patterns[mesh_speed][i].interval;
  }

  // Update the mesh pattern of exhaustive motion search for intraBC
  // Though intraBC mesh pattern is populated for all frame types, it is used
  // only for intra frames of screen contents
  for (i = 0; i < MAX_MESH_STEP; ++i) {
    sf->mv_sf.intrabc_mesh_patterns[i].range =
        intrabc_mesh_patterns[mesh_speed][i].range;
    sf->mv_sf.intrabc_mesh_patterns[i].interval =
        intrabc_mesh_patterns[mesh_speed][i].interval;
  }

  // Slow quant, dct and trellis not worthwhile for first pass
  // so make sure they are always turned off.
  if (is_stat_generation_stage(cpi))
    sf->rd_sf.optimize_coefficients = NO_TRELLIS_OPT;

  // No recode for 1 pass.
  if (oxcf->pass == AOM_RC_ONE_PASS && has_no_stats_stage(cpi))
    sf->hl_sf.recode_loop = DISALLOW_RECODE;

  set_subpel_search_method(&cpi->mv_search_params,
                           cpi->oxcf.unit_test_cfg.motion_vector_unit_test,
                           sf->mv_sf.subpel_search_method);

  // assert ensures that tx_domain_dist_level is accessed correctly
  assert(cpi->sf.rd_sf.tx_domain_dist_thres_level >= 0 &&
         cpi->sf.rd_sf.tx_domain_dist_thres_level < 4);
  memcpy(winner_mode_params->tx_domain_dist_threshold,
         tx_domain_dist_thresholds[cpi->sf.rd_sf.tx_domain_dist_thres_level],
         sizeof(winner_mode_params->tx_domain_dist_threshold));

  assert(cpi->sf.rd_sf.tx_domain_dist_level >= 0 &&
         cpi->sf.rd_sf.tx_domain_dist_level < TX_DOMAIN_DIST_LEVELS);
  memcpy(winner_mode_params->use_transform_domain_distortion,
         tx_domain_dist_types[cpi->sf.rd_sf.tx_domain_dist_level],
         sizeof(winner_mode_params->use_transform_domain_distortion));

  // assert ensures that coeff_opt_thresholds is accessed correctly
  assert(cpi->sf.rd_sf.perform_coeff_opt >= 0 &&
         cpi->sf.rd_sf.perform_coeff_opt < 9);
  memcpy(winner_mode_params->coeff_opt_thresholds,
         &coeff_opt_thresholds[cpi->sf.rd_sf.perform_coeff_opt],
         sizeof(winner_mode_params->coeff_opt_thresholds));

  // assert ensures that predict_skip_levels is accessed correctly
  assert(cpi->sf.tx_sf.tx_type_search.use_skip_flag_prediction >= 0 &&
         cpi->sf.tx_sf.tx_type_search.use_skip_flag_prediction < 3);
  memcpy(winner_mode_params->skip_txfm_level,
         predict_skip_levels[cpi->sf.tx_sf.tx_type_search
                                 .use_skip_flag_prediction],
         sizeof(winner_mode_params->skip_txfm_level));

  // assert ensures that tx_size_search_level is accessed correctly
  assert(cpi->sf.winner_mode_sf.tx_size_search_level >= 0 &&
         cpi->sf.winner_mode_sf.tx_size_search_level <= 3);
  memcpy(winner_mode_params->tx_size_search_methods,
         tx_size_search_methods[cpi->sf.winner_mode_sf.tx_size_search_level],
         sizeof(winner_mode_params->tx_size_search_methods));
  memcpy(winner_mode_params->predict_dc_level,
         predict_dc_levels[cpi->sf.winner_mode_sf.dc_blk_pred_level],
         sizeof(winner_mode_params->predict_dc_level));

  if (cpi->oxcf.row_mt == 1 && (cpi->mt_info.num_workers > 1)) {
    if (sf->inter_sf.inter_mode_rd_model_estimation == 1) {
      // Revert to type 2
      sf->inter_sf.inter_mode_rd_model_estimation = 2;
    }

#if !CONFIG_FPMT_TEST
    // Disable the speed feature 'prune_ref_frame_for_gm_search' to achieve
    // better parallelism when number of threads available are greater than or
    // equal to maximum number of reference frames allowed for global motion.
    if (sf->gm_sf.gm_search_type != GM_DISABLE_SEARCH &&
        (cpi->mt_info.num_workers >=
         gm_available_reference_frames[sf->gm_sf.gm_search_type]))
      sf->gm_sf.prune_ref_frame_for_gm_search = 0;
#endif
  }

  // This only applies to the real time mode. Adaptive gf refresh is disabled if
  // gf_cbr_boost_pct that is set by the user is larger than 0.
  if (cpi->oxcf.rc_cfg.gf_cbr_boost_pct > 0)
    sf->rt_sf.gf_refresh_based_on_qp = 0;
}